

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::ParsedFormatBase::ParsedFormatConsumer::Append
          (ParsedFormatConsumer *this,string_view s)

{
  ParsedFormatBase *pPVar1;
  string_view s_00;
  size_t sVar2;
  bool bVar3;
  reference pvVar4;
  value_type local_60;
  ParsedFormatConsumer *local_40;
  size_t local_38;
  size_t local_30;
  size_t text_end;
  ParsedFormatConsumer *this_local;
  string_view s_local;
  
  s_local._M_len = (size_t)s._M_str;
  this_local = (ParsedFormatConsumer *)s._M_len;
  text_end = (size_t)this;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (!bVar3) {
    local_40 = this_local;
    local_38 = s_local._M_len;
    s_00._M_str = (char *)s_local._M_len;
    s_00._M_len = (size_t)this_local;
    local_30 = AppendText(this,s_00);
    bVar3 = std::
            vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
            ::empty(&this->parsed->items_);
    if ((bVar3) ||
       (pvVar4 = std::
                 vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
                 ::back(&this->parsed->items_), sVar2 = local_30, (pvVar4->is_conversion & 1U) != 0)
       ) {
      pPVar1 = this->parsed;
      local_60.is_conversion = false;
      local_60.text_end = local_30;
      UnboundConversion::UnboundConversion(&local_60.conv);
      std::
      vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
      ::push_back(&pPVar1->items_,&local_60);
    }
    else {
      pvVar4 = std::
               vector<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20250127::str_format_internal::ParsedFormatBase::ConversionItem>_>
               ::back(&this->parsed->items_);
      pvVar4->text_end = sVar2;
    }
  }
  return true;
}

Assistant:

bool Append(string_view s) {
    if (s.empty()) return true;

    size_t text_end = AppendText(s);

    if (!parsed->items_.empty() && !parsed->items_.back().is_conversion) {
      // Let's extend the existing text run.
      parsed->items_.back().text_end = text_end;
    } else {
      // Let's make a new text run.
      parsed->items_.push_back({false, text_end, {}});
    }
    return true;
  }